

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

optional<pbrt::Spectrum> pbrt::PiecewiseLinearSpectrum::Read(string *fn,Allocator alloc)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  undefined8 extraout_RDX;
  string *in_RSI;
  aligned_storage_t<sizeof(pbrt::Spectrum),_alignof(pbrt::Spectrum)> in_RDI;
  optional<pbrt::Spectrum> oVar4;
  size_t i;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> v;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> lambda;
  vector<float,_std::allocator<float>_> vals;
  PiecewiseLinearSpectrum *in_stack_fffffffffffffed8;
  PiecewiseLinearSpectrum *in_stack_fffffffffffffee0;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffee8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  value_type in_stack_fffffffffffffefc;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  ulong uVar5;
  char *in_stack_ffffffffffffff10;
  polymorphic_allocator<float> *alloc_00;
  polymorphic_allocator<float> *alloc_01;
  aligned_storage_t<sizeof(pbrt::Spectrum),_alignof(pbrt::Spectrum)> args;
  string *this;
  ulong local_b8;
  polymorphic_allocator<float> local_b0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_a8;
  polymorphic_allocator<float> local_88;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_80;
  undefined4 local_60;
  string local_50 [32];
  vector<float,_std::allocator<float>_> local_30;
  
  this = local_50;
  args = in_RDI;
  std::__cxx11::string::string(this,(string *)in_RSI);
  ReadFloatFile(in_RSI);
  std::__cxx11::string::~string(local_50);
  bVar1 = std::vector<float,_std::allocator<float>_>::empty
                    ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffef0);
  if (bVar1) {
    Warning<std::__cxx11::string_const&>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    memset((void *)in_RDI,0,0x10);
    pstd::optional<pbrt::Spectrum>::optional((optional<pbrt::Spectrum> *)in_RDI);
    local_60 = 1;
  }
  else {
    sVar2 = std::vector<float,_std::allocator<float>_>::size(&local_30);
    if ((sVar2 & 1) == 0) {
      alloc_01 = &local_88;
      pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
                ((polymorphic_allocator<float> *)in_stack_fffffffffffffee0);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector(&local_80,alloc_01);
      alloc_00 = &local_b0;
      pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
                ((polymorphic_allocator<float> *)in_stack_fffffffffffffee0);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector(&local_a8,alloc_00);
      local_b8 = 0;
      while( true ) {
        uVar5 = local_b8;
        sVar2 = std::vector<float,_std::allocator<float>_>::size(&local_30);
        if (sVar2 >> 1 <= uVar5) break;
        if (local_b8 != 0) {
          pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_30,local_b8 * 2);
          in_stack_fffffffffffffefc = *pvVar3;
          in_stack_ffffffffffffff00 =
               (polymorphic_allocator<std::byte> *)
               pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::back(&local_80);
          if (in_stack_fffffffffffffefc <= *(float *)&in_stack_ffffffffffffff00->memoryResource) {
            in_stack_fffffffffffffef0 =
                 (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                 pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::back(&local_80);
            std::vector<float,_std::allocator<float>_>::operator[](&local_30,local_b8 * 2);
            Warning<std::__cxx11::string_const&,int,float&,float&>
                      ((char *)this,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
                       (int *)in_RDI,(float *)alloc_01,(float *)alloc_00);
            memset((void *)in_RDI,0,0x10);
            pstd::optional<pbrt::Spectrum>::optional((optional<pbrt::Spectrum> *)in_RDI);
            goto LAB_00a4025b;
          }
        }
        std::vector<float,_std::allocator<float>_>::operator[](&local_30,local_b8 * 2);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::push_back
                  (in_stack_fffffffffffffef0,(float *)in_stack_fffffffffffffee8);
        std::vector<float,_std::allocator<float>_>::operator[](&local_30,local_b8 * 2 + 1);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::push_back
                  (in_stack_fffffffffffffef0,(float *)in_stack_fffffffffffffee8);
        local_b8 = local_b8 + 1;
      }
      in_stack_fffffffffffffee0 =
           pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::PiecewiseLinearSpectrum,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>&,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (in_stack_ffffffffffffff00,
                      (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                      CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                      in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      Spectrum::TaggedPointer<pbrt::PiecewiseLinearSpectrum>
                ((Spectrum *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      pstd::optional<pbrt::Spectrum>::optional
                ((optional<pbrt::Spectrum> *)in_stack_fffffffffffffee0,
                 (Spectrum *)in_stack_fffffffffffffed8);
LAB_00a4025b:
      local_60 = 1;
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                (&in_stack_fffffffffffffee0->lambdas);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                (&in_stack_fffffffffffffee0->lambdas);
    }
    else {
      Warning<std::__cxx11::string_const&>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      memset((void *)in_RDI,0,0x10);
      pstd::optional<pbrt::Spectrum>::optional((optional<pbrt::Spectrum> *)in_RDI);
      local_60 = 1;
    }
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffef0);
  oVar4._8_8_ = extraout_RDX;
  oVar4.optionalValue = args;
  return oVar4;
}

Assistant:

pstd::optional<Spectrum> PiecewiseLinearSpectrum::Read(const std::string &fn,
                                                       Allocator alloc) {
    std::vector<Float> vals = ReadFloatFile(fn);
    if (vals.empty()) {
        Warning("%s: unable to read spectrum file.", fn);
        return {};
    } else {
        if (vals.size() % 2 != 0) {
            Warning("%s: extra value found in spectrum file.", fn);
            return {};
        }
        pstd::vector<Float> lambda, v;
        for (size_t i = 0; i < vals.size() / 2; ++i) {
            if (i > 0 && vals[2 * i] <= lambda.back()) {
                Warning("%s: spectrum file invalid: at %d'th entry, "
                        "wavelengths aren't "
                        "increasing: %f >= %f.",
                        fn, int(i), lambda.back(), vals[2 * i]);
                return {};
            }
            lambda.push_back(vals[2 * i]);
            v.push_back(vals[2 * i + 1]);
        }
        return Spectrum(alloc.new_object<PiecewiseLinearSpectrum>(lambda, v, alloc));
    }
}